

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O2

cmExternalMakefileProjectGenerator * __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator> *this)

{
  cmExtraCodeLiteGenerator *this_00;
  string sStack_38;
  
  this_00 = (cmExtraCodeLiteGenerator *)operator_new(0x90);
  cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator(this_00);
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
            (&sStack_38,&this->super_cmExternalMakefileProjectGeneratorFactory);
  std::__cxx11::string::_M_assign
            ((string *)&(this_00->super_cmExternalMakefileProjectGenerator).Name);
  std::__cxx11::string::~string((string *)&sStack_38);
  return &this_00->super_cmExternalMakefileProjectGenerator;
}

Assistant:

cmExternalMakefileProjectGenerator* CreateExternalMakefileProjectGenerator()
    const CM_OVERRIDE
  {
    T* p = new T;
    p->SetName(GetName());
    return p;
  }